

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

char * CVmObjString::reflect_to_str
                 (vm_val_t *new_str,char *result_buf,size_t result_buf_size,vm_val_t *val,char *fmt,
                 ...)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  vm_prop_id_t target_prop;
  char in_AL;
  char *pcVar4;
  size_t sVar5;
  undefined8 in_R9;
  uint16_t tmp;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vm_val_t refl;
  va_list args;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  target_prop = G_predef_X.reflection_valToSymbol;
  pvVar3 = sp_;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  refl.typ = VM_OBJ;
  refl.val.obj = G_predef_X.reflection_services;
  local_c0 = in_R9;
  if (G_predef_X.reflection_valToSymbol != 0 && G_predef_X.reflection_services != 0) {
    uVar2 = *(undefined4 *)&val->field_0x4;
    aVar1 = val->val;
    sp_ = sp_ + 1;
    pvVar3->typ = val->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    CVmRun::get_prop(&G_interpreter_X,0,&refl,target_prop,&refl,1,(vm_rcdesc *)0x0);
    pcVar4 = vm_val_t::get_as_string(&r0_);
    aVar1 = r0_.val;
    if (pcVar4 != (char *)0x0) {
      uVar2 = r0_._4_4_;
      new_str->typ = r0_.typ;
      *(undefined4 *)&new_str->field_0x4 = uVar2;
      new_str->val = aVar1;
      return pcVar4;
    }
  }
  args[0].reg_save_area = local_e8;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].gp_offset = 0x28;
  args[0].fp_offset = 0x30;
  sVar5 = t3vsprintf((char *)0x0,0,fmt,args);
  pcVar4 = alloc_str_buf(new_str,result_buf,result_buf_size,sVar5 + 3);
  args[0].gp_offset = 0x28;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = local_e8;
  t3vsprintf(pcVar4 + 2,sVar5 + 1,fmt,args);
  *(short *)pcVar4 = (short)(sVar5 + 1);
  return pcVar4;
}

Assistant:

const char *CVmObjString::reflect_to_str(
    VMG_ vm_val_t *new_str, char *result_buf, size_t result_buf_size,
    const vm_val_t *val, const char *fmt, ...)
{
    /* look for an exported reflectionServices object from the byteocde */
    vm_val_t refl;
    refl.set_obj(G_predef->reflection_services);
    vm_prop_id_t valToSym = G_predef->reflection_valToSymbol;
    if (refl.val.obj != VM_INVALID_OBJ && valToSym != VM_INVALID_PROP)
    {
        /* invoke reflectionServices.valToSymbol(val) */
        G_stk->push(val);
        G_interpreter->get_prop(vmg_ 0, &refl, valToSym, &refl, 1, 0);

        /* if we got a string, return it */
        const char *str = G_interpreter->get_r0()->get_as_string(vmg0_);
        if (str != 0)
        {
            /* set the return value */
            *new_str = *G_interpreter->get_r0();
            
            /* return the string buffer */
            return str;
        }
    }

    /* 
     *   No reflection services - fall back on the boilerplate format.  Start
     *   by calculating the amount of space we need for the formatted string,
     *   adding a byte for the trailing null.
     */
    va_list args;
    va_start(args, fmt);
    size_t need = t3vsprintf(0, 0, fmt, args) + 1;
    va_end(args);

    /* allocate space, including room for the length prefix */
    result_buf = alloc_str_buf(
        vmg_ new_str, result_buf, result_buf_size, need + VMB_LEN);

    /* do the formatting */
    va_start(args, fmt);
    t3vsprintf(result_buf + VMB_LEN, need, fmt, args);
    va_end(args);

    /* set the length prefix */
    vmb_put_len(result_buf, need);

    /* return the buffer */
    return result_buf;
}